

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest2.cpp
# Opt level: O0

void __thiscall UdpSocketTest::handleData(UdpSocketTest *this)

{
  Socket *in_RSI;
  
  handleData((UdpSocketTest *)&this[-1].super_TestCase.mTestName,in_RSI);
  return;
}

Assistant:

void UdpSocketTest::handleData( Socket *s )
{
  
	LOG_NOTICE( "called" );
	uint32_t num;
	
	int res = s->read( &num, 4 );
	
	if ( res != 4 )
		TestFailed( "Read Failed %d", res );

	num += 1;
	res = s->write( &num, 4 );

	if ( res != 4 )
		TestFailed( "Write Failed %d", res );

}